

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_special_statement(gravity_parser_t *parser)

{
  gtoken_s token;
  gravity_lexer_t *parser_00;
  undefined8 in_R8;
  undefined8 in_R9;
  gtoken_s local_50;
  char *local_28;
  char *specialid;
  gravity_lexer_t *pgStack_18;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  pgStack_18 = parser->lexer->p[parser->lexer->n - 1];
  lexer = (gravity_lexer_t *)parser;
  specialid._4_4_ = gravity_lexer_next(pgStack_18);
  if (specialid._4_4_ == TOK_SPECIAL) {
    local_28 = parse_identifier((gravity_parser_t *)lexer);
    parser_00 = lexer;
    gravity_lexer_token(&local_50,pgStack_18);
    token.lineno = local_50.lineno;
    token.type = local_50.type;
    token.colno = local_50.colno;
    token.position = local_50.position;
    token.bytes = local_50.bytes;
    token.length = local_50.length;
    token.fileid = local_50.fileid;
    token.builtin = local_50.builtin;
    token.value = local_50.value;
    report_error((gravity_parser_t *)parser_00,GRAVITY_WARNING,token,"%s",
                 "Unknown special token. Declaration will be ignored.",in_R8,in_R9);
    return (gnode_t *)0x0;
  }
  __assert_fail("type == TOK_SPECIAL",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                ,0x9ab,"gnode_t *parse_special_statement(gravity_parser_t *)");
}

Assistant:

static gnode_t *parse_special_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_special_statement");
    DECLARE_LEXER;

    // consume special @ symbol
    gtoken_t type = gravity_lexer_next(lexer);
    assert(type == TOK_SPECIAL);

    // special is really special so it has its own parser
    // because I don't want to mess standard syntax
    const char *specialid = parse_identifier(parser);
    if (specialid == NULL) goto handle_error;

handle_error:
    REPORT_WARNING(gravity_lexer_token(lexer), "%s", "Unknown special token. Declaration will be ignored.");
    return NULL;
}